

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-runtime-gvec.c
# Opt level: O1

void helper_gvec_smax16_s390x(void *d,void *a,void *b,uint32_t desc)

{
  uint uVar1;
  ulong uVar2;
  short sVar3;
  
  uVar1 = desc * 8 & 0xff;
  uVar2 = 0;
  do {
    sVar3 = *(short *)((long)b + uVar2);
    if (*(short *)((long)b + uVar2) < *(short *)((long)a + uVar2)) {
      sVar3 = *(short *)((long)a + uVar2);
    }
    *(short *)((long)d + uVar2) = sVar3;
    uVar2 = uVar2 + 2;
  } while (uVar2 < uVar1 + 8);
  if ((desc >> 2 & 0xf8) <= uVar1) {
    return;
  }
  helper_gvec_smax16_s390x_cold_1();
  return;
}

Assistant:

void HELPER(gvec_smax16)(void *d, void *a, void *b, uint32_t desc)
{
    intptr_t oprsz = simd_oprsz(desc);
    intptr_t i;

    for (i = 0; i < oprsz; i += sizeof(int16_t)) {
        int16_t aa = *(int16_t *)((char *)a + i);
        int16_t bb = *(int16_t *)((char *)b + i);
        int16_t dd = aa > bb ? aa : bb;
        *(int16_t *)((char *)d + i) = dd;
    }
    clear_high(d, oprsz, desc);
}